

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

iterator * __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::begin
          (IntervalMap<unsigned_long,_std::monostate,_0U> *this)

{
  const_iterator *in_RDI;
  iterator *it;
  const_iterator *this_00;
  
  this_00 = in_RDI;
  iterator::iterator((iterator *)in_RDI,(IntervalMap<unsigned_long,_std::monostate,_0U> *)in_RDI);
  const_iterator::setToBegin(this_00);
  return (iterator *)in_RDI;
}

Assistant:

iterator begin() {
        iterator it(*this);
        it.setToBegin();
        return it;
    }